

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&,bool>
          (BumpAllocator *this,Expression *args,optional<slang::ast::SequenceRepetition> *args_1,
          bool *args_2)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined3 uVar5;
  SimpleAssertionExpr *pSVar6;
  
  pSVar6 = (SimpleAssertionExpr *)allocate(this,0x30,8);
  bVar4 = (args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
          super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged;
  uVar5 = *(undefined3 *)
           &(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>.field_0x11;
  uVar2 = *(undefined8 *)
           &(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload;
  uVar3 = *(undefined8 *)
           ((long)&(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>).
                   _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>.
                   _M_payload + 8);
  bVar1 = *args_2;
  (pSVar6->super_AssertionExpr).kind = Simple;
  (pSVar6->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pSVar6->expr = args;
  (pSVar6->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged = bVar4;
  *(undefined3 *)
   &(pSVar6->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
    .super__Optional_payload_base<slang::ast::SequenceRepetition>.field_0x11 = uVar5;
  *(undefined8 *)
   &(pSVar6->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
    .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload = uVar2;
  *(undefined8 *)
   ((long)&(pSVar6->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
           _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload + 8) =
       uVar3;
  pSVar6->isNullExpr = bVar1;
  return pSVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }